

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cc
# Opt level: O0

uint64_t kratos::eval_unary_op(uint64_t value,ExprOp op,uint32_t width)

{
  runtime_error *this;
  uint uVar1;
  uint32_t width_local;
  ExprOp op_local;
  uint64_t value_local;
  
  switch(op) {
  case UInvert:
    value_local = invert(value,width);
    break;
  case UMinus:
    value_local = two_complement(value,width);
    break;
  case UPlus:
    value_local = value;
    break;
  case UOr:
    value_local = (uint64_t)(value != 0);
    break;
  case UNot:
    value_local = (uint64_t)((value != 0 ^ 0xffU) & 1);
    break;
  case UAnd:
    uVar1 = (int)value - ((uint)((value & 0xffffffff) >> 1) & 0x55555555);
    uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
    value_local = (uint64_t)((uVar1 + (uVar1 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18 == width);
    break;
  case UXor:
    uVar1 = (int)value - ((uint)((value & 0xffffffff) >> 1) & 0x55555555);
    uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
    value_local = (uint64_t)(int)(((uVar1 + (uVar1 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18) % 2);
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Not implemented");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return value_local;
}

Assistant:

uint64_t eval_unary_op(uint64_t value, ExprOp op, uint32_t width) {
    switch(op) {
        case ExprOp::UMinus:
            return two_complement(value, width);
        case ExprOp::UAnd:
            return static_cast<uint32_t>(__builtin_popcount(value)) == width;
        case ExprOp::UInvert:
            return invert(value, width);
        case ExprOp::UNot:
             return !value;
        case ExprOp::UOr:
            return (bool)(value);
        case ExprOp::UPlus:
            return value;
        case ExprOp::UXor: {
            return __builtin_popcount(value) % 2;
        }
        default: throw std::runtime_error("Not implemented");
    }
}